

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardConfigTab.cpp
# Opt level: O3

QVariant * __thiscall
ShortcutTableModel::headerData
          (QVariant *__return_storage_ptr__,ShortcutTableModel *this,int section,
          Orientation orientation,int role)

{
  QString local_28;
  
  if (orientation == Horizontal && role == 0) {
    if (section == 1) {
      QMetaObject::tr((char *)&local_28,(char *)&staticMetaObject,0x1b3e8b);
      QVariant::QVariant(__return_storage_ptr__,&local_28);
    }
    else {
      if (section != 0) goto LAB_00149431;
      QMetaObject::tr((char *)&local_28,(char *)&staticMetaObject,0x1b3e84);
      QVariant::QVariant(__return_storage_ptr__,&local_28);
    }
    if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,8);
      }
    }
  }
  else {
LAB_00149431:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual QVariant headerData(int section, Qt::Orientation orientation, int role = Qt::DisplayRole) const override {
        if (orientation == Qt::Horizontal && role == Qt::DisplayRole) {
            switch (section) {
                case 0:
                    return tr("Action");
                case 1:
                    return tr("Key sequence");
                default:
                    break;
            }
        }

        return {};
    }